

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void newBinNE(IntView<0> x,IntView<0> y,BoolView *r)

{
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<4> _y_01;
  IntView<4> _y_02;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  bool bVar1;
  int iVar2;
  int iVar3;
  BinNE<0,_0,_0> *this;
  BinNE<0,_4,_0> *this_00;
  IntView<0> y_local;
  IntView<0> x_local;
  BoolView local_68;
  BoolView local_58;
  BoolView local_48;
  BoolView local_38;
  
  y_local._8_8_ = y._8_8_;
  y_local.var = y.var;
  x_local._8_8_ = x._8_8_;
  x_local.var = x.var;
  iVar2 = IntView<0>::getType(&x_local);
  iVar3 = IntView<0>::getType(&y_local);
  if (iVar3 == 0 && iVar2 == 0) {
    bVar1 = BoolView::isTrue(r);
    this = (BinNE<0,_0,_0> *)operator_new(0x50);
    _x_00.a = x_local.a;
    _x_00.b = x_local.b;
    _x_00.var = x_local.var;
    _x.a = x_local.a;
    _x.b = x_local.b;
    _x.var = x_local.var;
    _y_00.a = y_local.a;
    _y_00.b = y_local.b;
    _y_00.var = y_local.var;
    _y.a = y_local.a;
    _y.b = y_local.b;
    _y.var = y_local.var;
    if (bVar1) {
      local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_38.v = r->v;
      local_38.s = r->s;
      BinNE<0,_0,_0>::BinNE(this,_x,_y,&local_38);
    }
    else {
      local_48.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_48.v = r->v;
      local_48.s = r->s;
      BinNE<0,_0,_1>::BinNE((BinNE<0,_0,_1> *)this,_x_00,_y_00,&local_48);
    }
  }
  if (iVar2 == 0 && iVar3 == 4) {
    bVar1 = BoolView::isTrue(r);
    this_00 = (BinNE<0,_4,_0> *)operator_new(0x50);
    _x_02.a = x_local.a;
    _x_02.b = x_local.b;
    _x_02.var = x_local.var;
    _x_01.a = x_local.a;
    _x_01.b = x_local.b;
    _x_01.var = x_local.var;
    _y_02.a = y_local.a;
    _y_02.b = y_local.b;
    _y_02.var = y_local.var;
    _y_01.a = y_local.a;
    _y_01.b = y_local.b;
    _y_01.var = y_local.var;
    if (bVar1) {
      local_58.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_58.v = r->v;
      local_58.s = r->s;
      BinNE<0,_4,_0>::BinNE(this_00,_x_01,_y_01,&local_58);
    }
    else {
      local_68.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_68.v = r->v;
      local_68.s = r->s;
      BinNE<0,_4,_1>::BinNE((BinNE<0,_4,_1> *)this_00,_x_02,_y_02,&local_68);
    }
  }
  return;
}

Assistant:

void newBinNE(IntView<> x, IntView<> y, const BoolView& r = bv_true) {
	const int u = x.getType();
	const int v = y.getType();
	Propagator* p = nullptr;

	BinProp(BinNE, 0, 0);
	BinProp(BinNE, 0, 4);

	assert(p);
}